

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FractionalSpacingModeCase::iterate
          (FractionalSpacingModeCase *this)

{
  Segment SVar1;
  float fVar2;
  SpacingMode SVar3;
  RenderContext *pRVar4;
  long lVar5;
  _Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::MemberPred<std::less<float>,_deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_float>_>
  __comp;
  _Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::MemberPred<std::less<float>,_deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_float>_>
  __comp_00;
  _Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::MemberPred<std::less<float>,_deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_float>_>
  __comp_01;
  LineData *pLVar6;
  undefined8 uVar7;
  pointer pfVar8;
  qpTestResult qVar9;
  float *pfVar10;
  pointer pSVar11;
  pointer pSVar12;
  byte bVar13;
  int iVar14;
  deUint32 dVar15;
  undefined4 uVar16;
  int iVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  float *pfVar18;
  undefined4 extraout_var_01;
  ObjectTraits *pOVar19;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar20;
  long *plVar21;
  undefined8 *puVar22;
  size_type sVar23;
  ulong uVar24;
  pointer __x;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
  *p_Var25;
  ulong uVar26;
  FractionalSpacingModeCase *pFVar27;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>_>
  __first;
  TestError *pTVar28;
  Functional *pFVar29;
  Segment *pSVar30;
  TestLog *pTVar31;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar32;
  float *pfVar33;
  char *pcVar34;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
  *this_00;
  FractionalSpacingModeCase *pFVar35;
  byte bVar36;
  int i;
  ulong uVar37;
  pointer pSVar38;
  pointer pSVar39;
  FractionalSpacingModeCase *pFVar40;
  FractionalSpacingModeCase *pFVar41;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>_>
  _Var42;
  qpTestResult testResult;
  FractionalSpacingModeCase *pFVar43;
  _func_int **__n;
  Segment SVar44;
  Segment SVar45;
  undefined8 uVar46;
  vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
  *this_01;
  ios_base *this_02;
  TestContext *this_03;
  undefined1 auVar47 [8];
  int *piVar48;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>_>
  _Var49;
  uint uVar50;
  size_type sVar51;
  int rangeNdx;
  int iVar52;
  long lVar53;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
  *this_04;
  bool bVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_01;
  undefined1 auVar58 [16];
  uint uVar61;
  undefined1 auVar59 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar60 [16];
  undefined1 auVar62 [12];
  undefined1 auVar63 [16];
  vector<float,_std::allocator<float>_> result_2;
  vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
  segmentsB;
  vector<float,_std::allocator<float>_> tessLevelCases;
  vector<float,_std::allocator<float>_> sortedCoords;
  int additionalSegmentLocation;
  float additionalSegmentLength;
  vector<int,_std::allocator<int>_> additionalSegmentLocations;
  vector<float,_std::allocator<float>_> additionalSegmentLengths;
  Result tfResult;
  RandomViewport viewport;
  TFHandler tfHandler;
  string failNote;
  undefined1 in_stack_fffffffffffff948 [12];
  float in_stack_fffffffffffff954;
  undefined1 local_6a8 [16];
  vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
  local_698;
  long lStack_680;
  vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
  local_678;
  long lStack_660;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_650;
  FractionalSpacingModeCase *local_648;
  FractionalSpacingModeCase *local_640;
  vector<float,_std::allocator<float>_> local_638;
  undefined1 local_618 [8];
  undefined8 uStack_610;
  undefined1 local_608 [16];
  pointer local_5f8;
  long lStack_5f0;
  ulong local_5e8;
  long local_5e0;
  undefined8 local_5d8;
  int local_5c8;
  undefined4 uStack_5c4;
  long local_5c0;
  Segment local_5b8 [2];
  undefined1 *local_5a8;
  undefined8 local_5a0;
  undefined1 local_598;
  undefined7 uStack_597;
  void *local_588;
  iterator iStack_580;
  int *local_578;
  void *local_568;
  iterator iStack_560;
  float *local_558;
  float local_548;
  vector<float,_std::allocator<float>_> local_540;
  vector<float,_std::allocator<float>_> local_528;
  RandomViewport local_510;
  undefined1 local_500 [8];
  undefined1 local_4f8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0 [6];
  ios_base local_490 [8];
  ios_base local_488 [264];
  undefined1 local_380 [8];
  undefined1 local_378 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370 [6];
  ios_base local_308 [264];
  RenderContext *local_200;
  ObjectWrapper local_1f8;
  ObjectWrapper local_1e0;
  ObjectWrapper local_1c8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  uStack_610 = local_618;
  local_650 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar14 = (*pRVar4->_vptr_RenderContext[4])(pRVar4);
  dVar15 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_510,(RenderTarget *)CONCAT44(extraout_var,iVar14),0x10,0x10,dVar15);
  dVar15 = (((this->m_program).m_ptr)->m_program).m_program;
  local_640 = this;
  iVar14 = (*pRVar4->_vptr_RenderContext[3])(pRVar4);
  local_5e8 = CONCAT44(local_5e8._4_4_,dVar15);
  local_618 = (undefined1  [8])CONCAT44(extraout_var_00,iVar14);
  uVar16 = (**(code **)(CONCAT44(extraout_var_00,iVar14) + 0xb48))(dVar15,"u_tessLevelOuter1");
  local_648 = (FractionalSpacingModeCase *)CONCAT44(local_648._4_4_,uVar16);
  local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  lVar53 = 0;
  do {
    fVar57 = (float)(&Functional::(anonymous_namespace)::FractionalSpacingModeCase::
                      genTessLevelCases()::rangeStarts)[lVar53];
    iVar14 = 0;
    do {
      fVar55 = (float)iVar14 / 10.0 + fVar57;
      local_500._0_4_ = fVar55;
      if (local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&local_638,
                   (iterator)
                   local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,(float *)local_500);
      }
      else {
        *local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_finish = fVar55;
        local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 != 10);
    lVar53 = lVar53 + 1;
  } while (lVar53 != 3);
  iVar14 = 0;
  do {
    local_500._0_4_ = (float)iVar14 + 0.3;
    if (local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&local_638,
                 (iterator)
                 local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,(float *)local_500);
    }
    else {
      *local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish = (float)iVar14 + 0.3;
      local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    iVar14 = iVar14 + 1;
  } while (iVar14 != 0x3f);
  pfVar33 = local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start + 1;
  pfVar18 = local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pfVar33 !=
      local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish &&
      local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    fVar57 = *local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      fVar55 = *pfVar33;
      pfVar10 = pfVar33;
      if (fVar55 <= fVar57) {
        fVar55 = fVar57;
        pfVar10 = pfVar18;
      }
      pfVar18 = pfVar10;
      pfVar33 = pfVar33 + 1;
      fVar57 = fVar55;
    } while (pfVar33 !=
             local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  iVar14 = getClampedRoundedTessLevel(local_640->m_spacing,*pfVar18);
  local_558 = (float *)0x0;
  local_568 = (void *)0x0;
  iStack_560._M_current = (float *)0x0;
  local_578 = (int *)0x0;
  local_588 = (void *)0x0;
  iStack_580._M_current = (int *)0x0;
  pRVar4 = ((local_640->super_TestCase).m_context)->m_renderCtx;
  local_200 = pRVar4;
  iVar17 = (*pRVar4->_vptr_RenderContext[3])(pRVar4);
  pOVar19 = glu::objectTraits(OBJECTTYPE_TRANSFORM_FEEDBACK);
  glu::ObjectWrapper::ObjectWrapper
            (&local_1f8,(Functions *)CONCAT44(extraout_var_01,iVar17),pOVar19);
  iVar17 = (*pRVar4->_vptr_RenderContext[3])(pRVar4);
  pOVar19 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&local_1e0,(Functions *)CONCAT44(extraout_var_02,iVar17),pOVar19);
  iVar17 = (*pRVar4->_vptr_RenderContext[3])(pRVar4);
  pOVar19 = glu::objectTraits(OBJECTTYPE_QUERY);
  glu::ObjectWrapper::ObjectWrapper
            (&local_1c8,(Functions *)CONCAT44(extraout_var_03,iVar17),pOVar19);
  iVar17 = (*local_200->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_04,iVar17) + 0x40))(0x8c8e,local_1e0.m_object);
  (**(code **)(CONCAT44(extraout_var_04,iVar17) + 0x150))(0x8c8e,(long)(iVar14 * 4 + 0x10),0,0x88e9)
  ;
  auVar47 = local_618;
  (**(code **)((long)local_618 + 0x1a00))(local_510.x,local_510.y,local_510.width,local_510.height);
  (**(code **)((long)auVar47 + 0x1680))(local_5e8 & 0xffffffff);
  pFVar43 = (FractionalSpacingModeCase *)&DAT_00000001;
  (**(code **)((long)auVar47 + 0xfd8))();
  if ((int)((ulong)((long)local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2) < 1) {
    fVar57 = (float)local_640->m_spacing;
LAB_01413b60:
    local_648 = (FractionalSpacingModeCase *)0x0;
    pFVar40 = (FractionalSpacingModeCase *)0x0;
    pFVar27 = (FractionalSpacingModeCase *)0x0;
    pFVar41 = local_648;
  }
  else {
    lVar53 = 0;
    do {
      fVar57 = local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[lVar53];
      local_5e0 = lVar53;
      (**(code **)((long)local_618 + 0x14e0))((ulong)local_648 & 0xffffffff);
      dVar15 = (**(code **)((long)local_618 + 0x800))();
      glu::checkError(dVar15,"Setup failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                      ,0x8cd);
      iVar14 = (*local_200->_vptr_RenderContext[3])();
      lVar53 = CONCAT44(extraout_var_05,iVar14);
      (**(code **)(lVar53 + 0xd0))(0x8e22,local_1f8.m_object);
      (**(code **)(lVar53 + 0x40))(0x8c8e,local_1e0.m_object);
      (**(code **)(lVar53 + 0x48))(0x8c8e,0,local_1e0.m_object);
      (**(code **)(lVar53 + 0x20))(0x8c88,local_1c8.m_object);
      (**(code **)(lVar53 + 0x30))(0);
      local_500 = (undefined1  [8])0x100000007;
      local_4f8._0_4_ = 3;
      local_4f0[0]._M_allocated_capacity = (qpTestLog *)0x0;
      glu::draw(local_200,(deUint32)local_5e8,0,(VertexArrayBinding *)0x0,(PrimitiveList *)local_500
                ,(DrawUtilCallback *)0x0);
      dVar15 = (**(code **)(lVar53 + 0x800))();
      glu::checkError(dVar15,"Draw failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                      ,0x15e);
      (**(code **)(lVar53 + 0x638))();
      (**(code **)(lVar53 + 0x628))(0x8c88);
      local_500._0_4_ = 0xffffffff;
      (**(code **)(lVar53 + 0xa20))(local_1c8.m_object,0x8866,local_500);
      uVar16 = local_500._0_4_;
      sVar51 = (size_type)(int)local_500._0_4_;
      if (sVar51 == 0xffffffffffffffff) {
        pTVar28 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar28,(char *)0x0,"result != (deUint32)-1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                   ,0x104);
        __cxa_throw(pTVar28,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      std::vector<float,_std::allocator<float>_>::vector
                (&local_528,sVar51,(allocator_type *)local_500);
      pfVar8 = local_528.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar20 = (**(code **)(lVar53 + 0xd00))(0x8c8e,0,(long)(uVar16 * 4),1);
      dVar15 = (**(code **)(lVar53 + 0x800))();
      local_5a8 = &local_598;
      local_5a0 = 0;
      local_598 = 0;
      plVar21 = (long *)std::__cxx11::string::append((char *)&local_5a8);
      local_608._0_8_ = &local_5f8;
      pFVar29 = (Functional *)(plVar21 + 2);
      if ((Functional *)*plVar21 == pFVar29) {
        local_5f8 = *(pointer *)pFVar29;
        lStack_5f0 = plVar21[3];
      }
      else {
        local_5f8 = *(pointer *)pFVar29;
        local_608._0_8_ = (Functional *)*plVar21;
      }
      local_608._8_8_ = plVar21[1];
      *plVar21 = (long)pFVar29;
      plVar21[1] = 0;
      *(undefined1 *)(plVar21 + 2) = 0;
      glu::getBufferTargetName(0x8c8e);
      plVar21 = (long *)std::__cxx11::string::append(local_608);
      local_678.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&local_678.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pSVar39 = (pointer)(plVar21 + 2);
      if ((pointer)*plVar21 == pSVar39) {
        local_678.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pSVar39;
        lStack_660 = plVar21[3];
      }
      else {
        local_678.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pSVar39;
        local_678.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar21;
      }
      local_678.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar21[1];
      *plVar21 = (long)pSVar39;
      plVar21[1] = 0;
      *(undefined1 *)(plVar21 + 2) = 0;
      plVar21 = (long *)std::__cxx11::string::append((char *)&local_678);
      local_698.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&local_698.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pSVar30 = (Segment *)(plVar21 + 2);
      if ((Segment *)*plVar21 == pSVar30) {
        local_698.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pSVar30;
        lStack_680 = plVar21[3];
      }
      else {
        local_698.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pSVar30;
        local_698.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_start = (Segment *)*plVar21;
      }
      local_698.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar21[1];
      *plVar21 = (long)pSVar30;
      plVar21[1] = 0;
      *(undefined1 *)(plVar21 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_500);
      std::ostream::operator<<((ostringstream *)local_500,uVar16 * 4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_500);
      std::ios_base::~ios_base(local_490);
      SVar44.index = 0xf;
      SVar44.length = 0.0;
      if (local_698.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&local_698.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        SVar44 = (Segment)local_698.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      SVar1 = (Segment)((long)&(local_698.
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->index + local_5c0);
      if ((ulong)SVar44 < (ulong)SVar1) {
        SVar45.index = 0xf;
        SVar45.length = 0.0;
        if ((Segment *)CONCAT44(uStack_5c4,local_5c8) != local_5b8) {
          SVar45 = local_5b8[0];
        }
        if ((ulong)SVar45 < (ulong)SVar1) goto LAB_0141271d;
        puVar22 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_5c8,0,(char *)0x0,
                             (ulong)local_698.
                                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
      }
      else {
LAB_0141271d:
        puVar22 = (undefined8 *)
                  std::__cxx11::string::_M_append((char *)&local_698,CONCAT44(uStack_5c4,local_5c8))
        ;
      }
      local_1b0 = (undefined1  [8])local_1a0;
      paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar22 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar22 == paVar32) {
        local_1a0[0]._0_8_ = paVar32->_M_allocated_capacity;
        local_1a0[0]._8_8_ = puVar22[3];
      }
      else {
        local_1a0[0]._0_8_ = paVar32->_M_allocated_capacity;
        local_1b0 = (undefined1  [8])*puVar22;
      }
      local_1a8 = (_func_int **)puVar22[1];
      *puVar22 = paVar32;
      puVar22[1] = 0;
      paVar32->_M_local_buf[0] = '\0';
      plVar21 = (long *)std::__cxx11::string::append(local_1b0);
      local_380 = (undefined1  [8])(local_378 + 8);
      pTVar31 = (TestLog *)(plVar21 + 2);
      if ((TestLog *)*plVar21 == pTVar31) {
        local_370[0]._0_8_ = pTVar31->m_log;
        local_370[0]._8_8_ = plVar21[3];
      }
      else {
        local_370[0]._0_8_ = pTVar31->m_log;
        local_380 = (undefined1  [8])*plVar21;
      }
      local_378 = (undefined1  [8])plVar21[1];
      *plVar21 = (long)pTVar31;
      plVar21[1] = 0;
      *(undefined1 *)(plVar21 + 2) = 0;
      glu::checkError(dVar15,(char *)local_380,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                      ,0x10d);
      if (local_380 != (undefined1  [8])(local_378 + 8)) {
        operator_delete((void *)local_380,(ulong)(local_370[0]._M_allocated_capacity + 1));
      }
      if (local_1b0 != (undefined1  [8])local_1a0) {
        operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
      }
      if ((Segment *)CONCAT44(uStack_5c4,local_5c8) != local_5b8) {
        operator_delete((Segment *)CONCAT44(uStack_5c4,local_5c8),(long)local_5b8[0] + 1);
      }
      if (local_698.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&local_698.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_698.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_698.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      if (local_678.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&local_678.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_678.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_678.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      if ((Functional *)local_608._0_8_ != (Functional *)&local_5f8) {
        operator_delete((void *)local_608._0_8_,(long)local_5f8 + 1);
      }
      if (local_5a8 != &local_598) {
        operator_delete(local_5a8,CONCAT71(uStack_597,local_598) + 1);
      }
      if (lVar20 == 0) {
        pTVar28 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar28,(char *)0x0,"mappedData != DE_NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                   ,0x10e);
        __cxa_throw(pTVar28,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (0 < (int)uVar16) {
        sVar23 = 0;
        do {
          pfVar8[sVar23] = *(float *)(lVar20 + sVar23 * 4);
          sVar23 = sVar23 + 1;
        } while (sVar51 != sVar23);
      }
      (**(code **)(lVar53 + 0x1670))(0x8c8e);
      local_548 = (float)uVar16;
      std::vector<float,_std::allocator<float>_>::vector(&local_540,&local_528);
      if (local_528.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_528.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_528.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_528.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      SVar3 = local_640->m_spacing;
      if (SVar3 == SPACINGMODE_FRACTIONAL_EVEN) {
        in_stack_fffffffffffff954 = 2.0;
        if (2.0 <= fVar57) {
          in_stack_fffffffffffff954 = fVar57;
        }
        fVar55 = ceilf(in_stack_fffffffffffff954);
        uVar37 = (ulong)(uint)((int)fVar55 % 2 + (int)fVar55);
      }
      else if (SVar3 == SPACINGMODE_FRACTIONAL_ODD) {
        in_stack_fffffffffffff954 = 1.0;
        if (1.0 <= fVar57) {
          in_stack_fffffffffffff954 = fVar57;
        }
        fVar55 = ceilf(in_stack_fffffffffffff954);
        uVar37 = (ulong)((int)fVar55 - ((int)fVar55 >> 0x1f) | 1);
      }
      else {
        uVar37 = 0xffffffff;
        in_stack_fffffffffffff954 = -1.0;
        if (SVar3 == SPACINGMODE_EQUAL) {
          in_stack_fffffffffffff954 = 1.0;
          if (1.0 <= fVar57) {
            in_stack_fffffffffffff954 = fVar57;
          }
          fVar55 = ceilf(in_stack_fffffffffffff954);
          uVar37 = (ulong)(uint)(int)fVar55;
        }
      }
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_608,&local_540);
      uVar7 = local_608._8_8_;
      uVar46 = local_608._0_8_;
      if (local_608._0_8_ != local_608._8_8_) {
        uVar24 = (long)(local_608._8_8_ - local_608._0_8_) >> 2;
        lVar53 = 0x3f;
        if (uVar24 != 0) {
          for (; uVar24 >> lVar53 == 0; lVar53 = lVar53 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_608._0_8_,local_608._8_8_,((uint)lVar53 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (uVar46,uVar7);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_500);
      std::ostream::_M_insert<double>((double)fVar57);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_500);
      std::ios_base::~ios_base(local_490);
      iVar14 = 0x1c;
      plVar21 = (long *)std::__cxx11::string::replace((ulong)&local_678,0,(char *)0x0,0x1c49600);
      local_698.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&local_698.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pSVar30 = (Segment *)(plVar21 + 2);
      if ((Segment *)*plVar21 == pSVar30) {
        local_698.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pSVar30;
        lStack_680 = plVar21[3];
      }
      else {
        local_698.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pSVar30;
        local_698.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_start = (Segment *)*plVar21;
      }
      local_698.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar21[1];
      *plVar21 = (long)pSVar30;
      plVar21[1] = 0;
      *(undefined1 *)(plVar21 + 2) = 0;
      puVar22 = (undefined8 *)std::__cxx11::string::append((char *)&local_698);
      local_380 = (undefined1  [8])(local_378 + 8);
      paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar22 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar22 == paVar32) {
        local_370[0]._0_8_ = paVar32->_M_allocated_capacity;
        local_370[0]._8_8_ = puVar22[3];
      }
      else {
        local_370[0]._0_8_ = paVar32->_M_allocated_capacity;
        local_380 = (undefined1  [8])*puVar22;
      }
      local_378 = (undefined1  [8])puVar22[1];
      *puVar22 = paVar32;
      puVar22[1] = 0;
      *(undefined1 *)(puVar22 + 2) = 0;
      containerStr<std::vector<float,std::allocator<float>>>
                ((string *)local_500,(Functional *)local_608._0_8_,
                 (vector<float,_std::allocator<float>_> *)local_608._8_8_,0,iVar14);
      uVar46 = (qpTestLog *)0xf;
      if (local_380 != (undefined1  [8])(local_378 + 8)) {
        uVar46 = local_370[0]._M_allocated_capacity;
      }
      if ((ulong)uVar46 < (qpTestLog *)((long)local_4f8 + (long)local_378)) {
        uVar46 = (qpTestLog *)0xf;
        if (local_500 != (undefined1  [8])(local_4f8 + 8)) {
          uVar46 = local_4f0[0]._M_allocated_capacity;
        }
        if ((ulong)uVar46 < (qpTestLog *)((long)local_4f8 + (long)local_378)) goto LAB_01412c10;
        auVar47 = local_378;
        puVar22 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_500,0,(char *)0x0,(ulong)local_380);
        iVar14 = SUB84(auVar47,0);
      }
      else {
LAB_01412c10:
        auVar47 = local_378;
        puVar22 = (undefined8 *)std::__cxx11::string::_M_append(local_380,(ulong)local_500);
        iVar14 = SUB84(auVar47,0);
      }
      paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar22 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar22 == paVar32) {
        local_1a0[0]._0_8_ = paVar32->_M_allocated_capacity;
        local_1a0[0]._8_8_ = puVar22[3];
        local_1b0 = (undefined1  [8])local_1a0;
      }
      else {
        local_1a0[0]._0_8_ = paVar32->_M_allocated_capacity;
        local_1b0 = (undefined1  [8])*puVar22;
      }
      local_1a8 = (_func_int **)puVar22[1];
      *puVar22 = paVar32;
      puVar22[1] = 0;
      paVar32->_M_local_buf[0] = '\0';
      __n = local_1a8;
      if (local_500 != (undefined1  [8])(local_4f8 + 8)) {
        __n = (_func_int **)(local_4f0[0]._M_allocated_capacity + 1);
        operator_delete((void *)local_500,(ulong)__n);
      }
      if (local_380 != (undefined1  [8])(local_378 + 8)) {
        __n = (_func_int **)(local_370[0]._M_allocated_capacity + 1);
        operator_delete((void *)local_380,(ulong)__n);
      }
      if (local_698.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&local_698.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __n = (_func_int **)
              ((long)local_698.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        operator_delete(local_698.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_start,(ulong)__n);
      }
      if (local_678.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&local_678.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __n = (_func_int **)
              ((long)local_678.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        operator_delete(local_678.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_start,(ulong)__n);
      }
      iVar17 = (int)uVar37;
      if (iVar17 + 1 ==
          (int)((ulong)((long)local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2)) {
        if ((((*(float *)local_608._0_8_ != 0.0) || (NAN(*(float *)local_608._0_8_))) ||
            (*(float *)(local_608._8_8_ + -4) != 1.0)) || (NAN(*(float *)(local_608._8_8_ + -4)))) {
          local_380 = (undefined1  [8])local_650;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_378,
                     "Failure: smallest coordinate should be 0.0 and biggest should be 1.0",0x44);
          local_500 = (undefined1  [8])
                      tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_380,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4f8,(char *)local_1b0,(long)local_1a8);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_01412f5c;
        }
        if (iVar17 < 0) {
          std::__throw_length_error("cannot create std::vector larger than max_size()");
        }
        this_00 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                   *)(long)iVar17;
        __x = std::
              _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
              ::_M_allocate(this_00,(size_t)__n);
        p_Var25 = this_00;
        pSVar39 = __x;
        if (iVar17 != 0) {
          do {
            pSVar39->index = -1;
            pSVar39->length = -1.0;
            pSVar39 = pSVar39 + 1;
            p_Var25 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                       *)((long)&p_Var25[-1]._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
          } while (p_Var25 !=
                   (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    *)0x0);
          uVar24 = 0;
          do {
            fVar57 = *(float *)(local_608._0_8_ + uVar24 * 4 + 4);
            fVar55 = *(float *)(local_608._0_8_ + uVar24 * 4);
            __x[uVar24].index = (int)uVar24;
            __x[uVar24].length = fVar57 - fVar55;
            uVar24 = uVar24 + 1;
          } while (uVar37 != uVar24);
        }
        uVar37 = (long)pSVar39 - (long)__x;
        sVar51 = (long)uVar37 >> 3;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&local_698,sVar51,
                   (allocator_type *)&local_678);
        uVar50 = (uint)(uVar37 >> 3);
        if (0 < (int)uVar50) {
          uVar24 = 0;
          do {
            (&(local_698.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
               ._M_impl.super__Vector_impl_data._M_start)->index)[uVar24] = (int)__x[uVar24].length;
            uVar24 = uVar24 + 1;
          } while ((uVar50 & 0x7fffffff) != uVar24);
        }
        containerStr<std::vector<float,std::allocator<float>>>
                  ((string *)local_380,
                   (Functional *)
                   local_698.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (vector<float,_std::allocator<float>_> *)
                   local_698.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                   ._M_impl.super__Vector_impl_data._M_finish,0,iVar14);
        plVar21 = (long *)std::__cxx11::string::replace((ulong)local_380,0,(char *)0x0,0x1c4973d);
        local_500 = (undefined1  [8])(local_4f8 + 8);
        pTVar31 = (TestLog *)(plVar21 + 2);
        if ((TestLog *)*plVar21 == pTVar31) {
          local_4f0[0]._0_8_ = pTVar31->m_log;
          local_4f0[0]._8_8_ = plVar21[3];
        }
        else {
          local_4f0[0]._0_8_ = pTVar31->m_log;
          local_500 = (undefined1  [8])*plVar21;
        }
        local_4f8 = (undefined1  [8])plVar21[1];
        *plVar21 = (long)pTVar31;
        plVar21[1] = 0;
        *(undefined1 *)(plVar21 + 2) = 0;
        std::__cxx11::string::_M_append(local_1b0,(ulong)local_500);
        if (local_500 != (undefined1  [8])(local_4f8 + 8)) {
          operator_delete((void *)local_500,(ulong)(local_4f0[0]._M_allocated_capacity + 1));
        }
        if (local_380 != (undefined1  [8])(local_378 + 8)) {
          operator_delete((void *)local_380,(ulong)(local_370[0]._M_allocated_capacity + 1));
        }
        if (local_698.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
            ._M_impl.super__Vector_impl_data._M_start != (Segment *)0x0) {
          operator_delete(local_698.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_698.
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_698.
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        local_698.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_698.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_start = (Segment *)0x0;
        local_698.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_finish = (Segment *)0x0;
        local_678.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_678.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_start = (Segment *)0x0;
        local_678.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ._M_impl.super__Vector_impl_data._M_finish = (Segment *)0x0;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
        ::push_back(&local_698,__x);
        local_5d8 = sVar51;
        if (1 < (int)(uint)sVar51) {
          lVar53 = (ulong)((uint)sVar51 & 0x7fffffff) - 1;
          pSVar39 = __x;
          do {
            pSVar38 = local_678.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pSVar11 = local_698.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            fVar57 = pSVar39[1].length -
                     (local_698.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start)->length;
            auVar63._0_4_ = -fVar57;
            auVar63._4_4_ = 0x80000000;
            auVar63._8_4_ = 0x80000000;
            auVar63._12_4_ = 0x80000000;
            if (auVar63._0_4_ <= fVar57) {
              auVar63._0_4_ = fVar57;
            }
            this_01 = &local_698;
            if ((0.001 <= auVar63._0_4_) &&
               (this_01 = &local_678,
               local_678.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_678.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
               ._M_impl.super__Vector_impl_data._M_finish)) {
              fVar55 = pSVar39[1].length -
                       (local_678.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_start)->length;
              fVar57 = -fVar55;
              if (-fVar55 <= fVar55) {
                fVar57 = fVar55;
              }
              if (0.001 <= fVar57) {
                local_380 = (undefined1  [8])local_650;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_378,
                           "Failure: couldn\'t divide segments to 2 groups by length; ",0x39);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_378,"e.g. segment of length ",0x17);
                std::ostream::_M_insert<double>((double)pSVar39[1].length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_378," isn\'t approximately equal to either ",0x25);
                std::ostream::_M_insert<double>((double)pSVar11->length);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378," or ",4);
                std::ostream::_M_insert<double>((double)pSVar38->length);
                local_500 = (undefined1  [8])
                            tcu::MessageBuilder::operator<<
                                      ((MessageBuilder *)local_380,
                                       (EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4f8,(char *)local_1b0,(long)local_1a8);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                goto LAB_01413925;
              }
            }
            std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
            ::push_back(this_01,pSVar39 + 1);
            lVar53 = lVar53 + -1;
            pSVar39 = pSVar39 + 1;
          } while (lVar53 != 0);
        }
        pSVar38 = local_678.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar12 = local_698.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pSVar11 = local_698.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pSVar39 = local_698.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((local_698.
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_698.
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
             ._M_impl.super__Vector_impl_data._M_finish ||
             in_stack_fffffffffffff954 != (float)iVar17) ||
           (local_678.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_678.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          if ((local_698.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               local_698.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
               ._M_impl.super__Vector_impl_data._M_finish) ||
             (local_678.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_678.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
              ._M_impl.super__Vector_impl_data._M_finish)) {
            fVar57 = -1.0;
            if (uVar37 != 8) {
              fVar57 = __x->length;
            }
            local_5a8 = (undefined1 *)CONCAT44(local_5a8._4_4_,fVar57);
            local_5c8 = -1;
            bVar54 = true;
            goto LAB_01413558;
          }
          if (((long)local_698.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_698.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                     ._M_impl.super__Vector_impl_data._M_start != 0x10) &&
             ((long)local_678.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_678.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0x10)) {
            local_380 = (undefined1  [8])local_650;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_378,
                       "Failure: when dividing the segments to 2 groups by length, neither of the two groups has exactly 2 or 0 segments in it"
                       ,0x76);
            local_500 = (undefined1  [8])
                        tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_380,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4f8,(char *)local_1b0,(long)local_1a8);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_014134d8;
          }
          if ((long)local_678.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_678.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0x10) {
            local_698.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_678.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_698.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_678.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_698.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_678.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_678.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
            ._M_impl.super__Vector_impl_data._M_start = pSVar39;
            local_678.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
            ._M_impl.super__Vector_impl_data._M_finish = pSVar11;
            local_678.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar12;
          }
          pSVar38 = local_678.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar39 = local_698.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pSVar11 = local_698.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar12 = local_698.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((long)local_698.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_698.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x10) {
            if ((local_698.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_start)->length <
                (local_678.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_start)->length) {
              local_698.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   local_678.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_678.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar39;
              pSVar11 = local_678.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pSVar12 = local_678.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              local_678.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   local_698.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_678.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_698.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
            }
LAB_014137cb:
            local_698.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
            ._M_impl.super__Vector_impl_data._M_finish = pSVar12;
            local_698.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
            ._M_impl.super__Vector_impl_data._M_start = pSVar11;
            pSVar38 = local_678.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            iVar14 = (local_678.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start)->index;
            iVar17 = local_678.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].index;
            iVar52 = (int)local_5d8;
            if (iVar14 + iVar17 + 1 != iVar52) {
              local_380 = (undefined1  [8])local_650;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_378,
                         "Failure: the two additional segments aren\'t placed symmetrically; ",0x42)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_378,"one is at index ",0x10);
              std::ostream::operator<<((ostringstream *)local_378,pSVar38->index);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_378," and other is at index ",0x17);
              std::ostream::operator<<((ostringstream *)local_378,pSVar38[1].index);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_378," (note: the two indexes should sum to ",0x26);
              std::ostream::operator<<((ostringstream *)local_378,iVar52 + -1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_378,", i.e. numberOfSegments-1)",0x1a);
              local_500 = (undefined1  [8])
                          tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)local_380,
                                     (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4f8,(char *)local_1b0,(long)local_1a8);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
              goto LAB_01413925;
            }
            local_5a8 = (undefined1 *)
                        CONCAT44(local_5a8._4_4_,
                                 (local_678.
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->length);
            if ((((long)local_698.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_698.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_start != 0x10) ||
                (local_5c8 = -1,
                (local_678.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_start)->length <
                (local_698.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_start)->length + -0.001)) &&
               (local_5c8 = iVar17, iVar14 < iVar17)) {
              local_5c8 = iVar14;
            }
            bVar54 = true;
          }
          else {
            if ((local_678.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_start)->length <=
                (local_698.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_start)->length + 0.001) goto LAB_014137cb;
            local_380 = (undefined1  [8])local_650;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_378,
                       "Failure: the two additional segments are longer than the other segments",
                       0x47);
            local_500 = (undefined1  [8])
                        tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_380,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4f8,(char *)local_1b0,(long)local_1a8);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_01413925:
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
            std::ios_base::~ios_base(local_488);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
            std::ios_base::~ios_base(local_308);
            bVar54 = false;
          }
LAB_01413971:
          operator_delete(pSVar38,(long)local_678.
                                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pSVar38);
          pSVar39 = local_698.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          local_380 = (undefined1  [8])local_650;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_378,
                     "Failure: clamped and final tessellation level are equal, but not all segments are of equal length."
                     ,0x62);
          local_500 = (undefined1  [8])
                      tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_380,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4f8,(char *)local_1b0,(long)local_1a8);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_014134d8:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
          std::ios_base::~ios_base(local_488);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
          std::ios_base::~ios_base(local_308);
          bVar54 = false;
LAB_01413558:
          if (pSVar38 != (Segment *)0x0) goto LAB_01413971;
        }
        if (pSVar39 != (Segment *)0x0) {
          operator_delete(pSVar39,(long)local_698.
                                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingSingleInternal::Segment>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pSVar39);
        }
        operator_delete(__x,(long)this_00 << 3);
      }
      else {
        local_380 = (undefined1  [8])local_650;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_378,"Failure: number of vertices is ",0x1f);
        std::ostream::_M_insert<unsigned_long>((ulong)local_378);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,"; expected ",0xb);
        std::ostream::operator<<((ostringstream *)local_378,iVar17 + 1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_378," (clamped tessellation level is ",0x20);
        std::ostream::_M_insert<double>((double)in_stack_fffffffffffff954);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,")",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_378,"; final level (clamped level rounded up to ",0x2b);
        pcVar34 = "odd";
        if (SVar3 == SPACINGMODE_FRACTIONAL_EVEN) {
          pcVar34 = "even";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_378,pcVar34,(ulong)(SVar3 == SPACINGMODE_FRACTIONAL_EVEN) + 3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,") is ",5);
        std::ostream::operator<<(local_378,iVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_378,
                   " and should equal the number of segments, i.e. number of vertices minus 1",0x49)
        ;
        local_500 = (undefined1  [8])
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_380,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4f8,(char *)local_1b0,(long)local_1a8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_01412f5c:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
        std::ios_base::~ios_base(local_488);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
        std::ios_base::~ios_base(local_308);
        bVar54 = false;
      }
      if (local_1b0 != (undefined1  [8])local_1a0) {
        operator_delete((void *)local_1b0,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
      }
      if ((Functional *)local_608._0_8_ != (Functional *)0x0) {
        operator_delete((void *)local_608._0_8_,(long)local_5f8 - local_608._0_8_);
      }
      if (!bVar54) {
        if (local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        this_03 = (local_640->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        pcVar34 = "Invalid tessellation coordinates";
        testResult = QP_TEST_RESULT_FAIL;
        goto LAB_01414416;
      }
      if (iStack_560._M_current == local_558) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&local_568,iStack_560,(float *)&local_5a8)
        ;
      }
      else {
        *iStack_560._M_current = local_5a8._0_4_;
        iStack_560._M_current = iStack_560._M_current + 1;
      }
      if (iStack_580._M_current == local_578) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_588,iStack_580,&local_5c8);
      }
      else {
        *iStack_580._M_current = local_5c8;
        iStack_580._M_current = iStack_580._M_current + 1;
      }
      if (local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      lVar53 = local_5e0 + 1;
      iVar14 = (int)((ulong)((long)local_638.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_638.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
    } while (lVar53 < iVar14);
    fVar57 = (float)local_640->m_spacing;
    pFVar43 = local_640;
    if (iVar14 < 1) goto LAB_01413b60;
    lVar53 = 0;
    pFVar40 = (FractionalSpacingModeCase *)0x0;
    pFVar43 = (FractionalSpacingModeCase *)0x0;
    pfVar33 = local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pFVar35 = (FractionalSpacingModeCase *)0x0;
    pfVar18 = local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      fVar55 = pfVar18[lVar53];
      fVar56 = *(float *)((long)local_568 + lVar53 * 4);
      iVar14 = *(int *)((long)local_588 + lVar53 * 4);
      if (pFVar40 == pFVar43) {
        local_618._0_4_ = fVar56;
        uVar37 = (long)pFVar40 - (long)pFVar35;
        if (uVar37 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar26 = ((long)uVar37 >> 2) * -0x5555555555555555;
        uVar24 = uVar26;
        if (pFVar40 == pFVar35) {
          uVar24 = 1;
        }
        this_04 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
                   *)(uVar24 + uVar26);
        if ((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
             *)0xaaaaaaaaaaaaaa9 < this_04) {
          this_04 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
                     *)0xaaaaaaaaaaaaaaa;
        }
        if (CARRY8(uVar24,uVar26)) {
          this_04 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
                     *)0xaaaaaaaaaaaaaaa;
        }
        pFVar27 = (FractionalSpacingModeCase *)
                  std::
                  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
                  ::_M_allocate(this_04,(size_t)pFVar43);
        *(float *)((long)pFVar27 + uVar37) = fVar55;
        *(undefined4 *)((long)pFVar27 + uVar37 + 4) = local_618._0_4_;
        *(int *)((long)pFVar27 + uVar37 + 8) = iVar14;
        pFVar41 = pFVar27;
        for (pFVar43 = pFVar35; pFVar40 != pFVar43;
            pFVar43 = (FractionalSpacingModeCase *)
                      ((long)&(pFVar43->super_TestCase).super_TestCase.super_TestNode.m_testCtx + 4)
            ) {
          *(int *)&(pFVar41->super_TestCase).super_TestCase.super_TestNode.m_testCtx =
               *(int *)&(pFVar43->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
          (pFVar41->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (pFVar43->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode;
          pFVar41 = (FractionalSpacingModeCase *)
                    ((long)&(pFVar41->super_TestCase).super_TestCase.super_TestNode.m_testCtx + 4);
        }
        if (pFVar35 != (FractionalSpacingModeCase *)0x0) {
          operator_delete(pFVar35,uVar37);
        }
        pFVar43 = (FractionalSpacingModeCase *)
                  ((long)&(pFVar27->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode +
                  (long)this_04 * 0xc);
        pfVar33 = local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pfVar18 = local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      else {
        *(float *)&(pFVar40->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = fVar55;
        *(float *)((long)&(pFVar40->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 4
                  ) = fVar56;
        *(int *)&(pFVar40->super_TestCase).super_TestCase.super_TestNode.m_testCtx = iVar14;
        pFVar27 = pFVar35;
        pFVar41 = pFVar40;
      }
      pFVar40 = (FractionalSpacingModeCase *)
                ((long)&(pFVar41->super_TestCase).super_TestCase.super_TestNode.m_testCtx + 4);
      lVar53 = lVar53 + 1;
      pFVar35 = pFVar27;
      in_stack_fffffffffffff954 = fVar57;
      pFVar41 = pFVar43;
    } while (lVar53 < (int)((ulong)((long)pfVar33 - (long)pfVar18) >> 2));
  }
  local_648 = pFVar41;
  local_5e8 = (long)pFVar40 - (long)pFVar27;
  __first._M_current =
       std::
       _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
       ::_M_allocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>_>
                      *)(((long)local_5e8 >> 2) * -0x5555555555555555),(size_t)pFVar43);
  _Var49._M_current = __first._M_current;
  if (pFVar27 != pFVar40) {
    lVar53 = 0;
    do {
      lVar20 = lVar53;
      puVar22 = (undefined8 *)
                ((long)&(pFVar27->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode +
                lVar20);
      *(undefined4 *)((long)&(__first._M_current)->additionalSegmentLocation + lVar20) =
           *(undefined4 *)(puVar22 + 1);
      *(undefined8 *)((long)&(__first._M_current)->tessLevel + lVar20) = *puVar22;
      lVar53 = lVar20 + 0xc;
    } while ((FractionalSpacingModeCase *)((long)puVar22 + 0xc) != pFVar40);
    if (lVar53 != 0) {
      _Var49._M_current = (LineData *)((long)&__first._M_current[1].tessLevel + lVar20);
      uVar37 = (lVar53 >> 2) * -0x5555555555555555;
      lVar5 = 0x3f;
      if (uVar37 != 0) {
        for (; uVar37 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp._M_comp._12_4_ = in_stack_fffffffffffff954;
      __comp._M_comp._0_12_ = in_stack_fffffffffffff948;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::MemberPred<std::less<float>,deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,float>>>
                (__first,_Var49,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,__comp);
      if (lVar53 < 0xc1) {
        __comp_01._M_comp._12_4_ = in_stack_fffffffffffff954;
        __comp_01._M_comp._0_12_ = in_stack_fffffffffffff948;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>>>,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::MemberPred<std::less<float>,deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,float>>>
                  (__first,_Var49,__comp_01);
      }
      else {
        __comp_00._M_comp._12_4_ = in_stack_fffffffffffff954;
        __comp_00._M_comp._0_12_ = in_stack_fffffffffffff948;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData>>>,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::MemberPred<std::less<float>,deqp::gles31::Functional::(anonymous_namespace)::VerifyFractionalSpacingMultipleInternal::LineData,float>>>
                  (__first,__first._M_current + 0x10,__comp_00);
        if (lVar53 != 0xc0) {
          _Var42._M_current = __first._M_current + 0x10;
          do {
            fVar55 = (_Var42._M_current)->tessLevel;
            fVar2 = (_Var42._M_current)->additionalSegmentLength;
            iVar14 = (_Var42._M_current)->additionalSegmentLocation;
            fVar56 = _Var42._M_current[-1].tessLevel;
            pLVar6 = _Var42._M_current;
            while (fVar55 < fVar56) {
              pLVar6->additionalSegmentLocation = pLVar6[-1].additionalSegmentLocation;
              fVar56 = pLVar6[-1].additionalSegmentLength;
              pLVar6->tessLevel = pLVar6[-1].tessLevel;
              pLVar6->additionalSegmentLength = fVar56;
              fVar56 = pLVar6[-2].tessLevel;
              pLVar6 = pLVar6 + -1;
            }
            pLVar6->tessLevel = fVar55;
            pLVar6->additionalSegmentLength = fVar2;
            pLVar6->additionalSegmentLocation = iVar14;
            bVar54 = (LineData *)((long)&(__first._M_current)->tessLevel + lVar20) !=
                     _Var42._M_current;
            _Var42._M_current = _Var42._M_current + 1;
          } while (bVar54);
        }
      }
    }
  }
  uVar50 = (int)((long)_Var49._M_current - (long)__first._M_current >> 2) * -0x55555555;
  if (1 < (int)uVar50) {
    uVar37 = (ulong)(uVar50 & 0x7fffffff);
    lVar53 = uVar37 - 1;
    piVar48 = &__first._M_current[1].additionalSegmentLocation;
    do {
      iVar14 = *piVar48;
      if ((-1 < iVar14) && (iVar17 = piVar48[-3], -1 < iVar17)) {
        if ((uint)fVar57 < 3) {
          if (iVar14 != iVar17) {
            fVar55 = *(float *)(&DAT_01c434fc + (ulong)(uint)fVar57 * 4);
            uVar50 = -(uint)(((LineData *)(piVar48 + -2))->tessLevel <= fVar55);
            fVar56 = (float)(~uVar50 & (uint)((LineData *)(piVar48 + -2))->tessLevel |
                            uVar50 & (uint)fVar55);
            uVar50 = -(uint)((float)piVar48[-5] <= fVar55);
            fVar55 = (float)(~uVar50 & piVar48[-5] | (uint)fVar55 & uVar50);
            if ((fVar56 == fVar55) && (!NAN(fVar56) && !NAN(fVar55))) goto LAB_01413f67;
          }
        }
        else if (iVar14 != iVar17) {
LAB_01413f67:
          local_380 = (undefined1  [8])local_650;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_378,
                     "Failure: additional segments not located identically for two edges with identical clamped tessellation levels"
                     ,0x6d);
          local_500 = (undefined1  [8])
                      tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_380,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4f8,"Note: tessellation levels are ",0x1e);
          std::ostream::_M_insert<double>((double)((LineData *)(piVar48 + -2))->tessLevel);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8," and ",5);
          std::ostream::_M_insert<double>((double)(float)piVar48[-5]);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4f8," (clamped level ",0x10);
          if (fVar57 == 2.8026e-45) {
            auVar62 = ZEXT812(0x40000000);
LAB_014142e0:
            if (auVar62._0_4_ <= ((LineData *)(piVar48 + -2))->tessLevel) {
              auVar62._4_8_ = auVar62._4_8_;
              auVar62._0_4_ = ((LineData *)(piVar48 + -2))->tessLevel;
            }
            fVar57 = auVar62._0_4_;
          }
          else {
            if ((fVar57 == 1.4013e-45) || (fVar57 == 0.0)) {
              auVar62 = ZEXT812(0x3f800000);
              goto LAB_014142e0;
            }
            fVar57 = -1.0;
          }
          std::ostream::_M_insert<double>((double)fVar57);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,")",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4f8,"; but first additional segments located at indices ",0x33
                    );
          std::ostream::operator<<((ostringstream *)local_4f8,*piVar48);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8," and ",5);
          std::ostream::operator<<((ostringstream *)local_4f8,piVar48[-3]);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4f8,", respectively",0xe);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
          std::ios_base::~ios_base(local_488);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
          this_02 = local_308;
          goto LAB_014143af;
        }
      }
      piVar48 = piVar48 + 3;
      lVar53 = lVar53 + -1;
    } while (lVar53 != 0);
    lVar53 = uVar37 - 1;
    _Var49._M_current = __first._M_current;
LAB_01413d43:
    fVar55 = _Var49._M_current[1].additionalSegmentLength;
    if ((fVar55 < 0.0) || (fVar56 = (_Var49._M_current)->additionalSegmentLength, fVar56 < 0.0))
    goto LAB_01413f41;
    fVar2 = _Var49._M_current[1].tessLevel;
    if (fVar57 == 2.8026e-45) {
      local_5e0 = CONCAT44(local_5e0._4_4_,fVar56);
      auVar60._4_4_ = (_Var49._M_current)->tessLevel;
      auVar60._0_4_ = fVar2;
      auVar60._8_8_ = 0;
      local_6a8 = maxps(_DAT_01b51e20,auVar60);
      fVar56 = ceilf(local_6a8._0_4_);
      local_5d8 = CONCAT44(extraout_XMM0_Db_01,fVar56);
      local_618._4_4_ = local_6a8._4_4_;
      local_618._0_4_ = local_6a8._4_4_;
      uStack_610._0_4_ = local_6a8._4_4_;
      uStack_610._4_4_ = local_6a8._4_4_;
      fVar56 = ceilf((float)local_6a8._4_4_);
      iVar14 = (int)(float)local_5d8;
      iVar17 = (int)fVar56;
      uVar50 = iVar14 * 2 - (iVar14 - (iVar14 >> 0x1f) & 0xfffffffeU);
      uVar61 = iVar17 * 2 - (iVar17 - (iVar17 >> 0x1f) & 0xfffffffeU);
LAB_01413ef4:
      fVar56 = (float)local_5e0;
      if (uVar61 != uVar50) goto LAB_01413f41;
    }
    else {
      if (fVar57 == 1.4013e-45) {
        local_5e0 = CONCAT44(local_5e0._4_4_,fVar56);
        auVar59._4_4_ = (_Var49._M_current)->tessLevel;
        auVar59._0_4_ = fVar2;
        auVar59._8_8_ = 0;
        local_6a8 = maxps(_DAT_01a25cf0,auVar59);
        fVar56 = ceilf(local_6a8._0_4_);
        local_5d8 = CONCAT44(extraout_XMM0_Db_00,fVar56);
        local_618._4_4_ = local_6a8._4_4_;
        local_618._0_4_ = local_6a8._4_4_;
        uStack_610._0_4_ = local_6a8._4_4_;
        uStack_610._4_4_ = local_6a8._4_4_;
        fVar56 = ceilf((float)local_6a8._4_4_);
        uVar50 = (int)(float)local_5d8 - ((int)(float)local_5d8 >> 0x1f) | 1;
        uVar61 = (int)fVar56 - ((int)fVar56 >> 0x1f) | 1;
        goto LAB_01413ef4;
      }
      uVar50 = 0xffffffff;
      _local_618 = ZEXT812(0xbf800000);
      uStack_610._4_4_ = 0;
      local_6a8 = _local_618;
      if (fVar57 == 0.0) {
        local_5e0 = CONCAT44(local_5e0._4_4_,fVar56);
        auVar58._4_4_ = (_Var49._M_current)->tessLevel;
        auVar58._0_4_ = fVar2;
        auVar58._8_8_ = 0;
        local_6a8 = maxps(_DAT_01a25cf0,auVar58);
        fVar56 = ceilf(local_6a8._0_4_);
        local_5d8 = CONCAT44(extraout_XMM0_Db,fVar56);
        local_618._4_4_ = local_6a8._4_4_;
        local_618._0_4_ = local_6a8._4_4_;
        uStack_610._0_4_ = local_6a8._4_4_;
        uStack_610._4_4_ = local_6a8._4_4_;
        fVar56 = ceilf((float)local_6a8._4_4_);
        uVar50 = (uint)(float)local_5d8;
        uVar61 = (uint)fVar56;
        goto LAB_01413ef4;
      }
    }
    if (fVar56 <= fVar55) {
      if ((fVar55 != fVar56) || (NAN(fVar55) || NAN(fVar56))) {
        if (((float)local_6a8._0_4_ == (float)local_618._0_4_) &&
           (!NAN((float)local_6a8._0_4_) && !NAN((float)local_618._0_4_))) goto LAB_01414049;
      }
      goto LAB_01413f41;
    }
LAB_01414049:
    local_1b0 = (undefined1  [8])local_650;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "Failure: additional segment length isn\'t monotonically decreasing with the fraction <n> - <f>, among edges with same final tessellation level"
               ,0x8d);
    local_380 = (undefined1  [8])
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
    ;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_378,
               "Note: <f> stands for the clamped tessellation level and <n> for the final (rounded and clamped) tessellation level"
               ,0x72);
    local_500 = (undefined1  [8])
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_380,(EndMessageToken *)&tcu::TestLog::EndMessage)
    ;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4f8,"Note: two edges have tessellation levels ",0x29);
    std::ostream::_M_insert<double>((double)(_Var49._M_current)->tessLevel);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8," and ",5);
    std::ostream::_M_insert<double>((double)_Var49._M_current[1].tessLevel);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8," respectively",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,", clamped ",10);
    std::ostream::_M_insert<double>((double)(float)local_618._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8," and ",5);
    std::ostream::_M_insert<double>((double)(float)local_6a8._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,", final ",8);
    std::ostream::operator<<((ostringstream *)local_4f8,uVar50);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8," and ",5);
    std::ostream::operator<<((ostringstream *)local_4f8,uVar50);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,"; fractions are ",0x10)
    ;
    fVar57 = (float)(int)uVar50;
    std::ostream::_M_insert<double>((double)(fVar57 - (float)local_618._0_4_));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8," and ",5);
    std::ostream::_M_insert<double>((double)(fVar57 - (float)local_6a8._0_4_));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4f8,", but resulted in segment lengths ",0x22);
    std::ostream::_M_insert<double>((double)(_Var49._M_current)->additionalSegmentLength);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8," and ",5);
    std::ostream::_M_insert<double>((double)_Var49._M_current[1].additionalSegmentLength);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
    std::ios_base::~ios_base(local_488);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
    std::ios_base::~ios_base(local_308);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    this_02 = local_138;
LAB_014143af:
    std::ios_base::~ios_base(this_02);
    bVar13 = 0;
    goto LAB_014143b6;
  }
  bVar36 = 1;
  bVar13 = 1;
  if (__first._M_current != (LineData *)0x0) goto LAB_014143b6;
LAB_014143c6:
  if (pFVar27 == (FractionalSpacingModeCase *)0x0) {
    this_03 = (local_640->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    bVar36 = bVar36 ^ 1;
    testResult = (qpTestResult)bVar36;
    qVar9 = (uint)bVar36;
    if (bVar36 != 0) goto LAB_0141440f;
  }
  else {
    operator_delete(pFVar27,(long)local_648 - (long)pFVar27);
    this_03 = (local_640->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    testResult = (qpTestResult)(bVar36 ^ 1);
    qVar9 = testResult;
    if (bVar36 == 0) {
LAB_0141440f:
      testResult = qVar9;
      pcVar34 = "Invalid tessellation coordinates";
      goto LAB_01414416;
    }
  }
  pcVar34 = "Pass";
LAB_01414416:
  tcu::TestContext::setTestResult(this_03,testResult,pcVar34);
  glu::ObjectWrapper::~ObjectWrapper(&local_1c8);
  glu::ObjectWrapper::~ObjectWrapper(&local_1e0);
  glu::ObjectWrapper::~ObjectWrapper(&local_1f8);
  if (local_588 != (void *)0x0) {
    operator_delete(local_588,(long)local_578 - (long)local_588);
  }
  if (local_568 != (void *)0x0) {
    operator_delete(local_568,(long)local_558 - (long)local_568);
  }
  if (local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return STOP;
LAB_01413f41:
  _Var49._M_current = _Var49._M_current + 1;
  lVar53 = lVar53 + -1;
  if (lVar53 == 0) goto code_r0x01413f4e;
  goto LAB_01413d43;
code_r0x01413f4e:
  bVar13 = 1;
LAB_014143b6:
  bVar36 = bVar13;
  operator_delete(__first._M_current,local_5e8);
  goto LAB_014143c6;
}

Assistant:

FractionalSpacingModeCase::IterateResult FractionalSpacingModeCase::iterate (void)
{
	typedef TransformFeedbackHandler<float> TFHandler;

	TestLog&						log							= m_testCtx.getLog();
	const RenderContext&			renderCtx					= m_context.getRenderContext();
	const RandomViewport			viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32					programGL					= m_program->getProgram();
	const glw::Functions&			gl							= renderCtx.getFunctions();

	const int						tessLevelOuter1Loc			= gl.getUniformLocation(programGL, "u_tessLevelOuter1");

	// Second outer tessellation levels.
	const vector<float>				tessLevelCases				= genTessLevelCases();
	const int						maxNumVertices				= 1 + getClampedRoundedTessLevel(m_spacing, *std::max_element(tessLevelCases.begin(), tessLevelCases.end()));
	vector<float>					additionalSegmentLengths;
	vector<int>						additionalSegmentLocations;

	const TFHandler					tfHandler					(m_context.getRenderContext(), maxNumVertices);

	bool							success						= true;

	setViewport(gl, viewport);
	gl.useProgram(programGL);

	gl.patchParameteri(GL_PATCH_VERTICES, 1);

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < (int)tessLevelCases.size(); tessLevelCaseNdx++)
	{
		const float outerLevel1 = tessLevelCases[tessLevelCaseNdx];

		gl.uniform1f(tessLevelOuter1Loc, outerLevel1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Setup failed");

		{
			const TFHandler::Result		tfResult = tfHandler.renderAndGetPrimitives(programGL, GL_POINTS, 0, DE_NULL, 1);
			float						additionalSegmentLength;
			int							additionalSegmentLocation;

			success = verifyFractionalSpacingSingle(log, m_spacing, outerLevel1, tfResult.varying,
													additionalSegmentLength, additionalSegmentLocation);

			if (!success)
				break;

			additionalSegmentLengths.push_back(additionalSegmentLength);
			additionalSegmentLocations.push_back(additionalSegmentLocation);
		}
	}

	if (success)
		success = verifyFractionalSpacingMultiple(log, m_spacing, tessLevelCases, additionalSegmentLengths, additionalSegmentLocations);

	m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, success ? "Pass" : "Invalid tessellation coordinates");
	return STOP;
}